

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O3

Object * handle_native(Object *__return_storage_ptr__,Call c,Environment *env)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  long lVar5;
  undefined4 extraout_var;
  void *pvVar6;
  undefined8 uVar7;
  Object *pOVar8;
  char *in_RCX;
  Environment *env_00;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  Library *__ptr;
  
  iVar2 = strcmp(c.identifer,"LoadLibrary");
  if (iVar2 == 0) {
    load_library(__return_storage_ptr__,c.line,env,(char *)0x0);
  }
  else {
    iVar2 = strcmp(c.identifer,"UnloadLibrary");
    uVar10 = (ulong)(uint)c.line;
    if (iVar2 == 0) {
      pcVar11 = get_string("x",c.line,env);
      iVar3 = hasLib(pcVar11);
      __ptr = libraries;
      iVar2 = libCount;
      if (iVar3 == 0) {
        printf("\x1b[33m\n[Warning] Library \'%s\' is not loaded!\x1b[0m",pcVar11);
      }
      else {
        uVar10 = (ulong)(uint)libCount;
        if (uVar10 == 1) {
          unload_all();
        }
        else {
          if (0 < libCount) {
            lVar9 = 0;
            do {
              iVar3 = strcmp(*(char **)((long)&__ptr->name + lVar9),pcVar11);
              if (iVar3 == 0) {
                dlclose(*(undefined8 *)((long)&__ptr->handle + lVar9));
                lVar12 = dlerror();
                if (lVar12 != 0) {
                  printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar12);
                }
                __ptr = libraries;
                pvVar6 = libraries[(long)libCount + -1].handle;
                puVar1 = (undefined8 *)((long)&libraries->name + lVar9);
                *puVar1 = libraries[(long)libCount + -1].name;
                puVar1[1] = pvVar6;
                iVar2 = libCount;
                break;
              }
              lVar9 = lVar9 + 0x10;
            } while (uVar10 << 4 != lVar9);
          }
          libCount = iVar2 + -1;
          libraries = (Library *)realloc(__ptr,(long)iVar2 * 0x10 - 0x10);
        }
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
      (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
      __return_storage_ptr__->type = OBJECT_NULL;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
      (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    }
    else {
      if (libCount == 0) {
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to call %s : No libraries loaded!\x1b[0m"
               ,uVar10,c.identifer);
        stop();
      }
      lVar12 = 8;
      lVar9 = -1;
      do {
        lVar9 = lVar9 + 1;
        if (libCount <= lVar9) {
          pcVar11 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] Foreign routine \'%s\' not found in loaded libraries!\x1b[0m"
          ;
          printf("\x1b[31m\n[Runtime Error] [Line:%d] Foreign routine \'%s\' not found in loaded libraries!\x1b[0m"
                 ,uVar10,c.identifer);
          stop();
          if (env_00 != (Environment *)0x0) {
            in_RCX = get_string("x",(int)uVar10,env_00);
          }
          iVar2 = hasLib(in_RCX);
          pOVar8 = (Object *)CONCAT44(extraout_var,iVar2);
          if (iVar2 == 0) {
            pvVar6 = (void *)dlopen(in_RCX,1);
            if (pvVar6 == (void *)0x0) {
              uVar7 = dlerror();
              printf("\x1b[31m\n[Runtime Error] [Line:%d] %s\x1b[0m",uVar10 & 0xffffffff,uVar7);
              stop();
            }
            lVar12 = (long)libCount;
            libCount = libCount + 1;
            lVar9 = lVar12 * 0x10;
            pOVar8 = (Object *)realloc(libraries,lVar9 + 0x10);
            libraries = (Library *)pOVar8;
            *(char **)((long)&pOVar8->type + lVar12 * 2 * 8) = in_RCX;
            *(void **)((long)&pOVar8->field_1 + lVar9) = pvVar6;
          }
          *(undefined8 *)(pcVar11 + 0x30) = 0;
          *(undefined8 *)(pcVar11 + 0x38) = 0;
          *(undefined8 *)(pcVar11 + 0x20) = 0;
          pcVar11[0x28] = '\0';
          pcVar11[0x29] = '\0';
          pcVar11[0x2a] = '\0';
          pcVar11[0x2b] = '\0';
          pcVar11[0x2c] = '\0';
          pcVar11[0x2d] = '\0';
          pcVar11[0x2e] = '\0';
          pcVar11[0x2f] = '\0';
          *(undefined8 *)(pcVar11 + 0x10) = 0;
          pcVar11[0x18] = '\0';
          pcVar11[0x19] = '\0';
          pcVar11[0x1a] = '\0';
          pcVar11[0x1b] = '\0';
          pcVar11[0x1c] = '\0';
          pcVar11[0x1d] = '\0';
          pcVar11[0x1e] = '\0';
          pcVar11[0x1f] = '\0';
          *(undefined8 *)pcVar11 = 0;
          *(undefined8 *)(pcVar11 + 8) = 0x400000000;
          return pOVar8;
        }
        puVar1 = (undefined8 *)((long)&libraries->name + lVar12);
        lVar12 = lVar12 + 0x10;
        pcVar4 = (code *)dlsym(*puVar1,c.identifer);
        lVar5 = dlerror();
      } while (lVar5 != 0);
      (*pcVar4)(__return_storage_ptr__,uVar10,env);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Object handle_native(Call c, Environment *env){
    char *fname = c.identifer;
    int i = 0;
    if(strcmp(fname, "LoadLibrary") == 0)
        return load_library(c.line, env, NULL);
    else if(strcmp(fname, "UnloadLibrary") == 0)
        return unload_library(c.line, env);
    else
        return run_native(c, env);
}